

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O0

void printf_test(void)

{
  run_container_t *prVar1;
  run_container_t *B;
  run_container_t *in_stack_00000008;
  unsigned_long in_stack_00000010;
  
  prVar1 = run_container_create();
  _assert_true(in_stack_00000010,(char *)in_stack_00000008,(char *)CONCAT26(B._6_2_,B._0_6_),
               (int)((ulong)prVar1 >> 0x20));
  run_container_add(in_stack_00000008,B._6_2_);
  run_container_add(in_stack_00000008,B._6_2_);
  run_container_add(in_stack_00000008,B._6_2_);
  run_container_add(in_stack_00000008,B._6_2_);
  run_container_add(in_stack_00000008,B._6_2_);
  run_container_printf((run_container_t *)CONCAT26(B._6_2_,B._0_6_));
  printf("\n");
  run_container_free((run_container_t *)0x102abc);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    run_container_t* B = run_container_create();

    assert_non_null(B);

    run_container_add(B, 1);
    run_container_add(B, 2);
    run_container_add(B, 3);
    run_container_add(B, 10);
    run_container_add(B, 10000);

    run_container_printf(B);
    printf("\n");

    run_container_free(B);
}